

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O0

pair<bool,_mp::sol::Status> __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ProcessMOIterationPostsolvedSolution
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  bool bVar1;
  Solution *in_RDX;
  function<mp::Solution_()> *in_RDI;
  Status solst;
  bool local_9a;
  bool local_99 [117];
  Status local_24 [7];
  pair<bool,_mp::sol::Status> local_8;
  
  local_24[0] = std::function<mp::sol::Status_()>::operator()
                          ((function<mp::sol::Status_()> *)in_RDX);
  bVar1 = sol::IsProblemSolvedOrFeasible(SOLVED);
  if ((!bVar1) || (bVar1 = sol::IsProblemUnbounded(local_24[0]), bVar1)) {
    *(undefined4 *)&(in_RDI->super__Function_base)._M_functor = 3;
    local_9a = false;
    std::pair<bool,_mp::sol::Status>::pair<bool,_mp::sol::Status_&,_true>
              (&local_8,&local_9a,local_24);
  }
  else {
    std::function<mp::Solution_()>::operator()(in_RDI);
    Solution::~Solution(in_RDX);
    local_99[0] = true;
    std::pair<bool,_mp::sol::Status>::pair<bool,_mp::sol::Status_&,_true>
              (&local_8,local_99,local_24);
  }
  return local_8;
}

Assistant:

std::pair<bool, sol::Status> ProcessMOIterationPostsolvedSolution(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    auto solst = get_stt();
    assert(sol::Status::NOT_SET != solst);
    assert(IsMOActive());
    assert(MOManagerStatus::FINISHED != status_);
    if ((sol::IsProblemSolvedOrFeasible((sol::Status)solst)
        // || sol::IsProblemMaybeSolved(solst)    // Use this?
         )  && !sol::IsProblemUnbounded((sol::Status)solst)  // Don't want unbounded
        ) {                                                  // (but LIMIT can have this undiscovered)
      get_sol();    // This implicitly calls ProcessMOIterationUnpostsolvedSolution().
      return { true, solst };
      // We ignore the solution here - but having it provided
      // guarantees that the postsolve has been run.
    }
    status_ = MOManagerStatus::FINISHED;
    return { false, solst };
  }